

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

void cJSON_AddItemToObjectCS(cJSON *object,char *string,cJSON *item)

{
  byte *pbVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  
  if (string != (char *)0x0 && item != (cJSON *)0x0) {
    if (((item->type & 0x200) == 0) && (item->string != (char *)0x0)) {
      (*global_hooks.deallocate)(item->string);
    }
    item->string = string;
    pbVar1 = (byte *)((long)&item->type + 1);
    *pbVar1 = *pbVar1 | 2;
    if (object != (cJSON *)0x0) {
      pcVar2 = object->child;
      if (object->child == (cJSON *)0x0) {
        object->child = item;
      }
      else {
        do {
          pcVar3 = pcVar2;
          pcVar2 = pcVar3->next;
        } while (pcVar3->next != (cJSON *)0x0);
        pcVar3->next = item;
        item->prev = pcVar3;
      }
    }
  }
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_AddItemToObjectCS(cJSON *object, const char *string, cJSON *item)
{
    if ((item == NULL) || (string == NULL))
    {
        return;
    }
    if (!(item->type & cJSON_StringIsConst) && item->string)
    {
        global_hooks.deallocate(item->string);
    }
    item->string = (char*)string;
    item->type |= cJSON_StringIsConst;
    cJSON_AddItemToArray(object, item);
}